

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavMoveRequestForward
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImRect *bb_rel,ImGuiNavMoveFlags move_flags)

{
  ImVec2 *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  GImGui->NavMoveRequest = false;
  pIVar3->NavAnyRequest = pIVar3->NavInitRequest;
  pIVar3->NavMoveDir = move_dir;
  pIVar3->NavMoveClipDir = clip_dir;
  pIVar3->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
  pIVar3->NavMoveRequestFlags = move_flags;
  IVar2 = bb_rel->Max;
  pIVar1 = &pIVar3->NavWindow->NavRectRel[pIVar3->NavLayer].Min;
  *pIVar1 = bb_rel->Min;
  pIVar1[1] = IVar2;
  return;
}

Assistant:

void ImGui::NavMoveRequestForward(ImGuiDir move_dir, ImGuiDir clip_dir, const ImRect& bb_rel, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavMoveRequestForward == ImGuiNavForward_None);
    NavMoveRequestCancel();
    g.NavMoveDir = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
    g.NavMoveRequestFlags = move_flags;
    g.NavWindow->NavRectRel[g.NavLayer] = bb_rel;
}